

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * luaG_addinfo(lua_State *L,char *msg,TString *src,int line)

{
  size_t srclen;
  char *pcVar1;
  char **source;
  char buff [60];
  char local_58 [64];
  
  if (src == (TString *)0x0) {
    local_58[0] = '?';
    local_58[1] = '\0';
  }
  else {
    srclen = (size_t)src->shrlen;
    if ((long)srclen < 0) {
      srclen = (src->u).lnglen;
      source = (char **)src->contents;
    }
    else {
      source = &src->contents;
    }
    luaO_chunkid(local_58,(char *)source,srclen);
  }
  pcVar1 = luaO_pushfstring(L,"%s:%d: %s",local_58,(ulong)(uint)line,msg);
  return pcVar1;
}

Assistant:

const char *luaG_addinfo (lua_State *L, const char *msg, TString *src,
                                        int line) {
  char buff[LUA_IDSIZE];
  if (src) {
    size_t idlen;
    const char *id = getlstr(src, idlen);
    luaO_chunkid(buff, id, idlen);
  }
  else {  /* no source available; use "?" instead */
    buff[0] = '?'; buff[1] = '\0';
  }
  return luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
}